

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cpp
# Opt level: O1

void __thiscall unittest::UnitTest::TestParseGenerate3(UnitTest *this)

{
  bool result;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> os;
  long *local_1a0;
  long local_190 [2];
  ostringstream local_180 [112];
  ios_base local_110 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  result = runtest<char>("test3.ini","test3.output",
                         (basic_ostream<char,_std::char_traits<char>_> *)local_180);
  Assert::IsTrue(result);
  std::__cxx11::stringbuf::str();
  std::operator<<((wostream *)&std::wcout,(char *)local_1a0);
  if (local_1a0 != local_190) {
    operator_delete(local_1a0,local_190[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_180);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

TEST_METHOD(TestParseGenerate3)
		{
			std::basic_ostringstream<char> os;
			Assert::IsTrue(runtest<char>("test3.ini", "test3.output", os));
			Logger::WriteMessage(os.str().c_str());
		}